

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall cppcms::application::~application(application *this)

{
  hold_ptr<cppcms::application::_data> *this_00;
  _data *p_Var1;
  pointer ppaVar2;
  uint uVar3;
  ulong uVar4;
  
  this->_vptr_application = (_func_int **)&PTR__application_00288c18;
  this_00 = &this->d;
  p_Var1 = (this->d).ptr_;
  ppaVar2 = (p_Var1->managed_children).
            super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((p_Var1->managed_children).
      super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar2) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      if (ppaVar2[uVar4] != (application *)0x0) {
        (*ppaVar2[uVar4]->_vptr_application[1])();
      }
      (this_00->ptr_->managed_children).
      super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = (application *)0x0;
      uVar4 = (ulong)uVar3;
      ppaVar2 = (this_00->ptr_->managed_children).
                super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar3 = uVar3 + 1;
    } while (uVar4 < (ulong)((long)(this_00->ptr_->managed_children).
                                   super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar2 >> 3))
    ;
  }
  booster::atomic_counter::~atomic_counter(&this->refs_);
  booster::hold_ptr<cppcms::application::_data>::~hold_ptr(this_00);
  return;
}

Assistant:

application::~application()
{
	for(unsigned i=0;i<d->managed_children.size();i++) {
		delete d->managed_children[i];
		d->managed_children[i]=0;
	}
}